

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jar_xm.h
# Opt level: O2

void jar_xm_trigger_note(jar_xm_context_t *ctx,jar_xm_channel_context_t *ch,uint flags)

{
  uint64_t uVar1;
  float fVar2;
  
  if ((flags & 4) == 0) {
    ch->sample_position = 0.0;
    ch->ping = true;
  }
  if ((flags & 1) == 0) {
    ch->volume = ch->sample->volume;
  }
  ch->panning = ch->sample->panning;
  ch->sustained = true;
  ch->fadeout_volume = 1.0;
  ch->volume_envelope_volume = 1.0;
  ch->panning_envelope_panning = 0.5;
  ch->volume_envelope_frame_count = 0;
  ch->panning_envelope_frame_count = 0;
  ch->vibrato_note_offset = 0.0;
  ch->tremolo_volume = 0.0;
  ch->tremor_on = false;
  ch->autovibrato_ticks = 0;
  if (ch->vibrato_waveform_retrigger == true) {
    ch->vibrato_ticks = 0;
  }
  if (ch->tremolo_waveform_retrigger == true) {
    ch->tremolo_ticks = '\0';
  }
  if ((flags & 2) == 0) {
    fVar2 = jar_xm_period(ctx,ch->note);
    ch->period = fVar2;
    jar_xm_update_frequency(ctx,ch);
  }
  uVar1 = ctx->generated_samples;
  ch->latest_trigger = uVar1;
  if (ch->instrument != (jar_xm_instrument_t *)0x0) {
    ch->instrument->latest_trigger = uVar1;
  }
  if (ch->sample != (jar_xm_sample_t *)0x0) {
    ch->sample->latest_trigger = ctx->generated_samples;
  }
  return;
}

Assistant:

static void jar_xm_trigger_note(jar_xm_context_t* ctx, jar_xm_channel_context_t* ch, unsigned int flags) {
    if (!(flags & jar_xm_TRIGGER_KEEP_SAMPLE_POSITION)) {
        ch->sample_position = 0.f;
        ch->ping = true;
    };

    if (!(flags & jar_xm_TRIGGER_KEEP_VOLUME)) {
       if(ch->sample != NULL) {
        ch->volume = ch->sample->volume;
        };
    };
    ch->panning = ch->sample->panning;
    ch->sustained = true;
    ch->fadeout_volume = ch->volume_envelope_volume = 1.0f;
    ch->panning_envelope_panning = .5f;
    ch->volume_envelope_frame_count = ch->panning_envelope_frame_count = 0;
    ch->vibrato_note_offset = 0.f;
    ch->tremolo_volume = 0.f;
    ch->tremor_on = false;
    ch->autovibrato_ticks = 0;

    if(ch->vibrato_waveform_retrigger) { ch->vibrato_ticks = 0; } /* XXX: should the waveform itself also be reset to sine? */
    if(ch->tremolo_waveform_retrigger) { ch->tremolo_ticks = 0; }
    if(!(flags & jar_xm_TRIGGER_KEEP_PERIOD)) {
        ch->period = jar_xm_period(ctx, ch->note);
        jar_xm_update_frequency(ctx, ch);
    }
    ch->latest_trigger = ctx->generated_samples;
    if(ch->instrument != NULL) { ch->instrument->latest_trigger = ctx->generated_samples; }
    if(ch->sample != NULL) {     ch->sample->latest_trigger = ctx->generated_samples; }
}